

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::HaltonSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,HaltonSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  undefined8 uVar5;
  int64_t iVar6;
  int64_t iVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  int iVar9;
  undefined4 extraout_var;
  pointer pSVar11;
  long lVar12;
  allocator_type local_29;
  long lVar10;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  iVar9 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,(long)n * 0x48,8)
  ;
  lVar10 = CONCAT44(extraout_var,iVar9);
  pSVar11 = (__return_storage_ptr__->
            super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar12 = 0; (ulong)(uint)(~(n >> 0x1f) & n) * 0x48 - lVar12 != 0; lVar12 = lVar12 + 0x48) {
    *(undefined8 *)(lVar10 + 0x40 + lVar12) = *(undefined8 *)&this->sampleIndex;
    uVar2 = *(undefined8 *)&this->samplesPerPixel;
    TVar3 = (this->haltonPixelIndexer).baseScales.super_Tuple2<pbrt::Point2,_int>;
    TVar4 = (this->haltonPixelIndexer).baseExponents.super_Tuple2<pbrt::Point2,_int>;
    uVar5 = *(undefined8 *)(this->haltonPixelIndexer).multInverse;
    iVar6 = (this->haltonPixelIndexer).pixelSampleForIndex;
    iVar7 = (this->haltonPixelIndexer).sampleIndex;
    TVar8 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    puVar1 = (undefined8 *)(lVar10 + lVar12);
    *puVar1 = this->digitPermutations;
    puVar1[1] = uVar2;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 2) = TVar3;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 3) = TVar4;
    puVar1[4] = uVar5;
    puVar1[5] = iVar6;
    puVar1[6] = iVar7;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 7) = TVar8;
    (pSVar11->
    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    ).bits = lVar10 + lVar12 | 0x1000000000000;
    pSVar11 = pSVar11 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> HaltonSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    HaltonSampler *samplerMem = (HaltonSampler *)alloc.allocate_object<HaltonSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}